

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

void Cbs2_ManDeleteFanout_rec(Cbs2_Man_t *p,int iObj)

{
  undefined8 uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int i;
  uint uVar4;
  
  while( true ) {
    pGVar3 = Gia_ManObj(p->pAig,iObj);
    Cbs2_ObjDeleteFanout(p,iObj);
    uVar1 = *(undefined8 *)pGVar3;
    uVar4 = (uint)uVar1;
    if ((~uVar4 & 0x9fffffff) == 0) {
      return;
    }
    if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) break;
    i = iObj - (uVar4 & 0x1fffffff);
    iVar2 = Vec_IntEntry(&p->vFanout0,i);
    if (iVar2 != 0) {
      Cbs2_ManDeleteFanout_rec(p,i);
    }
    iObj = iObj - ((uint)((ulong)uVar1 >> 0x20) & 0x1fffffff);
    iVar2 = Vec_IntEntry(&p->vFanout0,iObj);
    if (iVar2 == 0) {
      return;
    }
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                ,0x5fa,"void Cbs2_ManDeleteFanout_rec(Cbs2_Man_t *, int)");
}

Assistant:

void Cbs2_ManDeleteFanout_rec( Cbs2_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pAig, iObj); int iFan0, iFan1;
    Cbs2_ObjDeleteFanout( p, iObj ); 
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    iFan0 = Gia_ObjFaninId0(pObj, iObj);
    iFan1 = Gia_ObjFaninId1(pObj, iObj);
    if ( Vec_IntEntry(&p->vFanout0, iFan0) )  Cbs2_ManDeleteFanout_rec( p, iFan0 );
    if ( Vec_IntEntry(&p->vFanout0, iFan1) )  Cbs2_ManDeleteFanout_rec( p, iFan1 );
}